

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O2

int main(void)

{
  lrtr_ip_addr *plVar1;
  long lVar2;
  int iVar3;
  pfx_record *ppVar4;
  char *__function;
  long lVar5;
  char *__assertion;
  uint8_t max_mask_len;
  pfxv_state *ppVar6;
  uint uVar7;
  long in_FS_OFFSET;
  trie_node **local_168;
  uint len;
  pfx_table pfxt;
  pfx_record local_108;
  pfxv_state res;
  undefined1 local_d4 [20];
  pthread_rwlock_t local_c0;
  pfx_record pfx;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pfx_table_init(&pfxt,(pfx_update_fp)0x0);
  pfx.asn = 0x7b;
  pfx.prefix.ver = LRTR_IPV4;
  lrtr_ip_str_to_addr("10.10.0.0",&pfx.prefix);
  pfx.min_len = '\x10';
  pfx.max_len = '\x18';
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xcb,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x7b,"10.10.0.0",'\x10',BGP_PFXV_STATE_VALID);
  validate(&pfxt,0x7c,"10.10.0.0",'\x10',BGP_PFXV_STATE_INVALID);
  validate(&pfxt,0x7b,"10.10.0.0",'\x18',BGP_PFXV_STATE_VALID);
  validate(&pfxt,0x7b,"10.10.10.0",'\x14',BGP_PFXV_STATE_VALID);
  validate(&pfxt,0x7b,"10.10.10.0",'\x19',BGP_PFXV_STATE_INVALID);
  validate(&pfxt,0x7b,"10.11.10.0",'\x10',BGP_PFXV_STATE_NOT_FOUND);
  plVar1 = &pfx.prefix;
  lrtr_ip_str_to_addr("10.10.0.0",plVar1);
  pfx.asn = 0x7a;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xd6,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x7a,"10.10.0.0",'\x12',BGP_PFXV_STATE_VALID);
  lrtr_ip_str_to_addr("11.10.0.0",plVar1);
  pfx.asn = 0x16;
  pfx.min_len = '\x11';
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xdc,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x16,"11.10.0.0",'\x11',BGP_PFXV_STATE_VALID);
  lrtr_ip_str_to_addr("2a01:4f8:131::",plVar1);
  pfx.min_len = '0';
  pfx.max_len = '0';
  pfx.asn = 0x7c;
  pfx.prefix.ver = LRTR_IPV6;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xe4,"void pfx_table_test(void)");
  }
  iVar3 = pfx_table_validate(&pfxt,0x7c,plVar1,'0',&res);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_validate(&pfxt, 124, &pfx.prefix, 48, &res) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xe5,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x7c,"2a01:4f8:131::",'0',BGP_PFXV_STATE_VALID);
  validate(&pfxt,0x7c,"2a01:4f8:131:15::",'8',BGP_PFXV_STATE_INVALID);
  iVar3 = lrtr_ip_str_to_addr("1.0.4.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.0.4.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xea,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x16';
  pfx.max_len = '\x16';
  pfx.asn = 0xdb8b;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xee,"void pfx_table_test(void)");
  }
  validate(&pfxt,pfx.asn,"1.0.4.0",pfx.min_len,BGP_PFXV_STATE_VALID);
  iVar3 = lrtr_ip_str_to_addr("1.8.1.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.8.1.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf1,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x18';
  pfx.max_len = '\x18';
  pfx.asn = 0x95c9;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf5,"void pfx_table_test(void)");
  }
  validate(&pfxt,pfx.asn,"1.8.1.0",pfx.min_len,BGP_PFXV_STATE_VALID);
  iVar3 = lrtr_ip_str_to_addr("1.8.8.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.8.8.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf8,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x18';
  pfx.max_len = '\x18';
  pfx.asn = 0x95c9;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xfc,"void pfx_table_test(void)");
  }
  validate(&pfxt,pfx.asn,"1.8.8.0",pfx.min_len,BGP_PFXV_STATE_VALID);
  pfx_table_free(&pfxt);
  iVar3 = lrtr_ip_str_to_addr("1.0.65.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.0.65.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x100,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x12';
  pfx.max_len = '\x12';
  pfx.asn = 0x46e0;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x104,"void pfx_table_test(void)");
  }
  validate(&pfxt,pfx.asn,"1.0.65.0",pfx.min_len,BGP_PFXV_STATE_VALID);
  pfx_table_free(&pfxt);
  iVar3 = lrtr_ip_str_to_addr("10.0.0.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x108,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x10';
  pfx.max_len = '\x10';
  pfx.asn = 0x7b;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x10c,"void pfx_table_test(void)");
  }
  validate(&pfxt,pfx.asn,"10.0.0.0",pfx.min_len,BGP_PFXV_STATE_VALID);
  validate(&pfxt,0x7c,"10.0.5.0",'\x18',BGP_PFXV_STATE_INVALID);
  pfx_table_free(&pfxt);
  iVar3 = lrtr_ip_str_to_addr("109.105.96.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"109.105.96.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x111,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x13';
  pfx.max_len = '\x13';
  pfx.asn = 0x7b;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x115,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x1c8,"109.105.128.0",'\x14',BGP_PFXV_STATE_NOT_FOUND);
  pfx_table_free(&pfxt);
  iVar3 = lrtr_ip_str_to_addr("190.57.224.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"190.57.224.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x119,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x13';
  pfx.max_len = '\x18';
  pfx.asn = 0x7b;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x11d,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x7b,"190.57.72.0",'\x15',BGP_PFXV_STATE_NOT_FOUND);
  pfx_table_free(&pfxt);
  iVar3 = lrtr_ip_str_to_addr("80.253.128.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"80.253.128.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x121,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x13';
  pfx.max_len = '\x13';
  pfx.asn = 0x7b;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x125,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x7b,"80.253.144.0",'\x14',BGP_PFXV_STATE_INVALID);
  iVar3 = lrtr_ip_str_to_addr("10.10.0.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.10.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x128,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x10';
  pfx.max_len = '\x10';
  pfx.asn = 0;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,300,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x7b,"10.10.0.0",'\x10',BGP_PFXV_STATE_INVALID);
  iVar3 = lrtr_ip_str_to_addr("10.0.0.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x12f,"void pfx_table_test(void)");
  }
  pfx.min_len = '\b';
  pfx.max_len = '\x0f';
  pfx.asn = 6;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x133,"void pfx_table_test(void)");
  }
  iVar3 = lrtr_ip_str_to_addr("10.0.0.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x135,"void pfx_table_test(void)");
  }
  pfx.min_len = '\b';
  pfx.max_len = '\x0f';
  pfx.asn = 5;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x139,"void pfx_table_test(void)");
  }
  iVar3 = lrtr_ip_str_to_addr("10.1.0.0",plVar1);
  if (iVar3 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.1.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x13b,"void pfx_table_test(void)");
  }
  pfx.min_len = '\x10';
  pfx.max_len = '\x10';
  pfx.asn = 5;
  iVar3 = pfx_table_add(&pfxt,&pfx);
  if (iVar3 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x13f,"void pfx_table_test(void)");
  }
  validate(&pfxt,0x7b,"10.1.0.0",'\x10',BGP_PFXV_STATE_INVALID);
  pfx_table_free(&pfxt);
  printf("%s() successful\n");
  pfx_table_init((pfx_table *)&pfx,(pfx_update_fp)0x0);
  local_c0.__size[0] = ' ';
  local_c0.__size[1] = ' ';
  res = 0x50;
  local_c0._8_8_ = (rtr_socket *)&pfxt;
  lrtr_ip_str_to_addr("10.11.10.0",(lrtr_ip_addr *)local_d4);
  iVar3 = pfx_table_add((pfx_table *)&pfx,(pfx_record *)&res);
  if (iVar3 == 0) {
    res = 0x5a;
    local_c0._8_8_ = (rtr_socket *)0x0;
    lrtr_ip_str_to_addr("10.11.10.0",(lrtr_ip_addr *)local_d4);
    iVar3 = pfx_table_add((pfx_table *)&pfx,(pfx_record *)&res);
    if (iVar3 == 0) {
      local_c0._8_8_ = (rtr_socket *)0x0;
      local_c0.__size[0] = '\x18';
      lrtr_ip_str_to_addr("192.168.0.0",(lrtr_ip_addr *)local_d4);
      iVar3 = pfx_table_add((pfx_table *)&pfx,(pfx_record *)&res);
      if (iVar3 == 0) {
        local_c0.__size[0] = '\b';
        local_c0._8_8_ = (rtr_socket *)&pfxt;
        lrtr_ip_str_to_addr("10.0.0.0",(lrtr_ip_addr *)local_d4);
        iVar3 = pfx_table_add((pfx_table *)&pfx,(pfx_record *)&res);
        if (iVar3 == 0) {
          len = 0;
          local_168 = (trie_node **)0x0;
          iVar3 = trie_get_children((trie_node *)pfx._0_8_,&local_168,&len);
          if (iVar3 == -1) {
            __assertion = "trie_get_children(pfxt.ipv4, &array, &len) != -1";
            __function = "void remove_src_test(void)";
            uVar7 = 0x4d;
          }
          else {
            free(local_168);
            local_168 = (trie_node **)0x0;
            if (len == 2) {
              pfx_table_src_remove((pfx_table *)&pfx,(rtr_socket *)&pfxt);
              len = 0;
              iVar3 = trie_get_children((trie_node *)pfx._0_8_,&local_168,&len);
              if (iVar3 == -1) {
                __assertion = "trie_get_children(pfxt.ipv4, &array, &len) != -1";
                __function = "void remove_src_test(void)";
                uVar7 = 0x55;
              }
              else {
                free(local_168);
                if (len == 1) {
                  validate((pfx_table *)&pfx,0x5a,"10.0.0.0",'\b',BGP_PFXV_STATE_NOT_FOUND);
                  validate((pfx_table *)&pfx,0x5a,"10.11.10.0",' ',BGP_PFXV_STATE_VALID);
                  ppVar6 = (pfxv_state *)0x2;
                  validate((pfx_table *)&pfx,0x50,"10.11.10.0",' ',BGP_PFXV_STATE_INVALID);
                  pfx_table_free((pfx_table *)&pfx);
                  printf("%s() successful\n");
                  pfx_table_init(&pfxt,(pfx_update_fp)0x0);
                  printf("Inserting %u records\n",0x2ffd0);
                  uVar7 = 0xfffffff0;
                  plVar1 = &pfx.prefix;
                  while( true ) {
                    if (uVar7 < 0xffff0000) {
                      puts("validating..");
                      uVar7 = 0xfffffff0;
                      do {
                        if (uVar7 < 0xffff0000) {
                          puts("removing records");
                          uVar7 = 0xfffffff0;
                          while( true ) {
                            max_mask_len = (uint8_t)ppVar6;
                            if (uVar7 < 0xffff0000) {
                              pfx_table_free(&pfxt);
                              printf("%s() successful\n");
                              pfx_table_init(&pfxt,(pfx_update_fp)0x0);
                              add_ip4_pfx_record(&pfxt,200,"10.100.255.0",'\x18',max_mask_len);
                              add_ip4_pfx_record(&pfxt,300,"255.0.0.0",'\x18',max_mask_len);
                              add_ip4_pfx_record(&pfxt,400,"128.0.0.0",'\x01',max_mask_len);
                              validate(&pfxt,400,"255.0.0.0",'\x18',BGP_PFXV_STATE_VALID);
                              pfx_table_free(&pfxt);
                              ppVar4 = (pfx_record *)calloc(6,0x28);
                              pfx_table_init(&pfxt,(pfx_update_fp)0x0);
                              create_ip4_pfx_record(ppVar4,1,"89.18.183.0",'\x18','\x18');
                              create_ip4_pfx_record(ppVar4 + 1,2,"109.164.0.0",'\x11','\x19');
                              create_ip4_pfx_record(ppVar4 + 2,3,"185.131.60.0",'\x16','\x18');
                              create_ip4_pfx_record(ppVar4 + 3,4,"185.146.28.0",'\x16','\x16');
                              create_ip4_pfx_record(ppVar4 + 4,5,"212.5.51.0",'\x18','\x18');
                              create_ip4_pfx_record(ppVar4 + 5,6,"213.175.86.0",'\x18','\x18');
                              lVar5 = 0;
                              while (lVar5 + 0x28 != 0x118) {
                                iVar3 = pfx_table_add(&pfxt,(pfx_record *)
                                                            ((long)&ppVar4->asn + lVar5));
                                lVar5 = lVar5 + 0x28;
                                if (iVar3 != 0) {
                                  __assert_fail("pfx_table_add(&pfxt, &records[i]) == PFX_SUCCESS",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                                ,0x17c,"void test_issue152(void)");
                                }
                              }
                              lVar5 = 0;
                              while (lVar5 + 0x28 != 0x118) {
                                iVar3 = pfx_table_remove(&pfxt,(pfx_record *)
                                                               ((long)&ppVar4->asn + lVar5));
                                lVar5 = lVar5 + 0x28;
                                if (iVar3 != 0) {
                                  __assert_fail("pfx_table_remove(&pfxt, &records[i]) == PFX_SUCCESS"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                                ,0x17f,"void test_issue152(void)");
                                }
                              }
                              free(ppVar4);
                              pfx_table_init((pfx_table *)&pfx,(pfx_update_fp)0x0);
                              pfx_table_init((pfx_table *)&res,(pfx_update_fp)0x0);
                              create_ip4_pfx_record((pfx_record *)&pfxt,1,"1.1.1.1",'\x18','\x18');
                              ppVar4 = (pfx_record *)(&pfxt.lock.__align + 2);
                              create_ip4_pfx_record(ppVar4,2,"2.2.2.2",'\x18','\x18');
                              create_ip4_pfx_record(&local_108,3,"3.3.3.3",'\x18','\x18');
                              puts("Adding to table one");
                              iVar3 = pfx_table_add((pfx_table *)&pfx,(pfx_record *)&pfxt);
                              if (iVar3 != 0) {
                                __assert_fail("pfx_table_add(&pfxt1, &records[0]) == PFX_SUCCESS",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                              ,0x1a5,"void test_pfx_merge(void)");
                              }
                              iVar3 = pfx_table_add((pfx_table *)&pfx,ppVar4);
                              if (iVar3 == 0) {
                                puts("Adding to table two");
                                iVar3 = pfx_table_add((pfx_table *)&res,ppVar4);
                                if (iVar3 != 0) {
                                  __assert_fail("pfx_table_add(&pfxt2, &records[1]) == PFX_SUCCESS",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                                ,0x1a8,"void test_pfx_merge(void)");
                                }
                                iVar3 = pfx_table_add((pfx_table *)&res,&local_108);
                                if (iVar3 == 0) {
                                  puts("Computing diff");
                                  pfx.prefix.u._8_8_ = update_cb1;
                                  local_d4._12_8_ = update_cb1;
                                  pfx_table_notify_diff
                                            ((pfx_table *)&res,(pfx_table *)&pfx,(rtr_socket *)0x1);
                                  pfx.prefix.u._8_8_ = 0;
                                  local_d4._12_8_ = 0;
                                  puts("Freeing table one");
                                  pfx_table_free((pfx_table *)&pfx);
                                  puts("Freeing table two");
                                  pfx_table_free((pfx_table *)&res);
                                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                                    return 0;
                                  }
                                  __stack_chk_fail();
                                }
                                __assert_fail("pfx_table_add(&pfxt2, &records[2]) == PFX_SUCCESS",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                              ,0x1a9,"void test_pfx_merge(void)");
                              }
                              __assert_fail("pfx_table_add(&pfxt1, &records[1]) == PFX_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                            ,0x1a6,"void test_pfx_merge(void)");
                            }
                            pfx.socket = (rtr_socket *)0x0;
                            pfx.min_len = ' ';
                            pfx.max_len = ' ';
                            pfx.prefix.ver = LRTR_IPV4;
                            pfx.asn = uVar7;
                            pfx.prefix.u.addr6.addr[0] =
                                 uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                 uVar7 << 0x18;
                            iVar3 = pfx_table_remove(&pfxt,&pfx);
                            if (iVar3 != 0) {
                              __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                            ,0xa7,"void mass_test(void)");
                            }
                            pfx.asn = uVar7 + 1;
                            iVar3 = pfx_table_remove(&pfxt,&pfx);
                            if (iVar3 != 0) break;
                            pfx.prefix.ver = LRTR_IPV6;
                            pfx.min_len = 0x80;
                            pfx.max_len = 0x80;
                            pfx.prefix.u.addr6.addr[2] = 0xfffffff0;
                            pfx.prefix.u.addr6.addr[0] = uVar7 - 0x10000;
                            iVar3 = pfx_table_remove(&pfxt,&pfx);
                            uVar7 = uVar7 - 1;
                            if (iVar3 != 0) {
                              __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                            ,0xb1,"void mass_test(void)");
                            }
                          }
                          __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                        ,0xaa,"void mass_test(void)");
                        }
                        pfx.min_len = ' ';
                        pfx.max_len = ' ';
                        pfx._0_8_ = pfx._0_8_ & 0xffffffff;
                        pfx.prefix.u.addr6.addr[0] =
                             uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                             uVar7 << 0x18;
                        iVar3 = pfx_table_validate(&pfxt,uVar7,plVar1,' ',&res);
                        if (iVar3 != 0) {
                          __assert_fail("pfx_table_validate(&pfxt, i, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                        ,0x8f,"void mass_test(void)");
                        }
                        if (res != BGP_PFXV_STATE_VALID) {
                          __assert_fail("res == BGP_PFXV_STATE_VALID",
                                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                        ,0x90,"void mass_test(void)");
                        }
                        iVar3 = pfx_table_validate(&pfxt,uVar7 + 1,plVar1,pfx.min_len,&res);
                        if (iVar3 != 0) {
                          __assert_fail("pfx_table_validate(&pfxt, i + 1, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                        ,0x91,"void mass_test(void)");
                        }
                        if (res != BGP_PFXV_STATE_VALID) {
                          __assert_fail("res == BGP_PFXV_STATE_VALID",
                                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                        ,0x92,"void mass_test(void)");
                        }
                        pfx.min_len = 0x80;
                        pfx.max_len = 0x80;
                        pfx.prefix.ver = LRTR_IPV6;
                        pfx.prefix.u.addr6.addr[2] = 0xfffffff0;
                        pfx.prefix.u.addr6.addr[0] = uVar7 - 0x10000;
                        ppVar6 = &res;
                        iVar3 = pfx_table_validate(&pfxt,uVar7 + 1,plVar1,0x80,&res);
                        if (iVar3 != 0) {
                          __assert_fail("pfx_table_validate(&pfxt, i + 1, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                        ,0x9a,"void mass_test(void)");
                        }
                        uVar7 = uVar7 - 1;
                      } while (res == BGP_PFXV_STATE_VALID);
                      __assert_fail("res == BGP_PFXV_STATE_VALID",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                    ,0x9b,"void mass_test(void)");
                    }
                    pfx.min_len = ' ';
                    pfx.max_len = ' ';
                    pfx.socket = (rtr_socket *)0x0;
                    pfx.prefix.u.addr6.addr[0] =
                         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                         uVar7 << 0x18;
                    pfx.prefix.ver = LRTR_IPV4;
                    pfx.asn = uVar7;
                    iVar3 = pfx_table_add(&pfxt,&pfx);
                    if (iVar3 != 0) break;
                    pfx.asn = uVar7 + 1;
                    iVar3 = pfx_table_add(&pfxt,&pfx);
                    if (iVar3 != 0) {
                      __assertion = "pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS";
                      __function = "void mass_test(void)";
                      uVar7 = 0x7e;
                      goto LAB_0010321e;
                    }
                    pfx.min_len = 0x80;
                    pfx.max_len = 0x80;
                    pfx.prefix.ver = LRTR_IPV6;
                    pfx.prefix.u.addr6.addr[2] = 0xfffffff0;
                    pfx.prefix.u.addr6.addr[0] = uVar7 - 0x10000;
                    iVar3 = pfx_table_add(&pfxt,&pfx);
                    uVar7 = uVar7 - 1;
                    if (iVar3 != 0) {
                      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                                    ,0x85,"void mass_test(void)");
                    }
                  }
                  __assertion = "pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS";
                  __function = "void mass_test(void)";
                  uVar7 = 0x7b;
                }
                else {
                  __assertion = "(len + 1) == 2";
                  __function = "void remove_src_test(void)";
                  uVar7 = 0x57;
                }
              }
            }
            else {
              __assertion = "(len + 1) == 3";
              __function = "void remove_src_test(void)";
              uVar7 = 0x50;
            }
          }
        }
        else {
          __assertion = "pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS";
          __function = "void remove_src_test(void)";
          uVar7 = 0x48;
        }
      }
      else {
        __assertion = "pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS";
        __function = "void remove_src_test(void)";
        uVar7 = 0x43;
      }
    }
    else {
      __assertion = "pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS";
      __function = "void remove_src_test(void)";
      uVar7 = 0x3e;
    }
  }
  else {
    __assertion = "pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS";
    __function = "void remove_src_test(void)";
    uVar7 = 0x39;
  }
LAB_0010321e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                ,uVar7,__function);
}

Assistant:

int main(void)
{
	pfx_table_test();
	remove_src_test();
	mass_test();
	test_issue99();
	test_issue152();
	test_pfx_merge();

	return EXIT_SUCCESS;
}